

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O2

void af_cjk_hints_compute_blue_edges(AF_GlyphHints hints,AF_CJKMetrics metrics,AF_Dimension dim)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  AF_Edge_conflict pAVar6;
  AF_Width pAVar7;
  AF_Width pAVar8;
  AF_Edge_conflict pAVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  AF_Width pAVar15;
  FT_Pos best_dist;
  bool bVar16;
  
  pAVar9 = hints->axis[dim].edges;
  pAVar6 = pAVar9 + hints->axis[dim].num_edges;
  lVar11 = (long)(int)metrics->axis[dim].scale;
  lVar3 = ((ulong)metrics->units_per_em / 0x28) * lVar11;
  iVar1 = (int)((ulong)(lVar3 + (lVar3 >> 0x3f) + 0x8000) >> 0x10);
  iVar5 = 0x20;
  if (iVar1 < 0x20) {
    iVar5 = iVar1;
  }
  for (; pAVar9 < pAVar6; pAVar9 = pAVar9 + 1) {
    uVar12 = (ulong)metrics->axis[dim].blue_count;
    pAVar8 = (AF_Width)0x0;
    pAVar7 = &metrics->axis[dim].blues[0].ref;
    iVar1 = iVar5;
    while (bVar16 = uVar12 != 0, uVar12 = uVar12 - 1, bVar16) {
      if (((*(uint *)&pAVar7[2].org & 1) != 0) &&
         (((*(uint *)&pAVar7[2].org & 2) == 0) == (hints->axis[dim].major_dir == (int)pAVar9->dir)))
      {
        lVar4 = (long)pAVar9->fpos;
        lVar3 = ((AF_WidthRec *)&pAVar7->org)->org;
        uVar13 = lVar4 - lVar3;
        uVar14 = -uVar13;
        if (0 < (long)uVar13) {
          uVar14 = uVar13;
        }
        uVar10 = lVar4 - pAVar7[1].org;
        uVar13 = -uVar10;
        if (0 < (long)uVar10) {
          uVar13 = uVar10;
        }
        pAVar15 = pAVar7;
        if (uVar13 < uVar14) {
          lVar3 = pAVar7[1].org;
          pAVar15 = pAVar7 + 1;
        }
        lVar4 = lVar4 - lVar3;
        lVar3 = -lVar4;
        if (0 < lVar4) {
          lVar3 = lVar4;
        }
        lVar3 = (int)lVar3 * lVar11;
        iVar2 = (int)((ulong)(lVar3 + (lVar3 >> 0x3f) + 0x8000) >> 0x10);
        if (iVar2 < iVar1) {
          pAVar8 = pAVar15;
        }
        if (iVar2 <= iVar1) {
          iVar1 = iVar2;
        }
      }
      pAVar7 = (AF_Width)&pAVar7[2].cur;
    }
    if (pAVar8 != (AF_Width)0x0) {
      pAVar9->blue_edge = pAVar8;
    }
  }
  return;
}

Assistant:

static void
  af_cjk_hints_compute_blue_edges( AF_GlyphHints  hints,
                                   AF_CJKMetrics  metrics,
                                   AF_Dimension   dim )
  {
    AF_AxisHints  axis       = &hints->axis[dim];
    AF_Edge       edge       = axis->edges;
    AF_Edge       edge_limit = edge + axis->num_edges;
    AF_CJKAxis    cjk        = &metrics->axis[dim];
    FT_Fixed      scale      = cjk->scale;
    FT_Pos        best_dist0;  /* initial threshold */


    /* compute the initial threshold as a fraction of the EM size */
    best_dist0 = FT_MulFix( metrics->units_per_em / 40, scale );

    if ( best_dist0 > 64 / 2 ) /* maximum 1/2 pixel */
      best_dist0 = 64 / 2;

    /* compute which blue zones are active, i.e. have their scaled */
    /* size < 3/4 pixels                                           */

    /* If the distant between an edge and a blue zone is shorter than */
    /* best_dist0, set the blue zone for the edge.  Then search for   */
    /* the blue zone with the smallest best_dist to the edge.         */

    for ( ; edge < edge_limit; edge++ )
    {
      FT_UInt   bb;
      AF_Width  best_blue = NULL;
      FT_Pos    best_dist = best_dist0;


      for ( bb = 0; bb < cjk->blue_count; bb++ )
      {
        AF_CJKBlue  blue = cjk->blues + bb;
        FT_Bool     is_top_right_blue, is_major_dir;


        /* skip inactive blue zones (i.e., those that are too small) */
        if ( !( blue->flags & AF_CJK_BLUE_ACTIVE ) )
          continue;

        /* if it is a top zone, check for right edges -- if it is a bottom */
        /* zone, check for left edges                                      */
        /*                                                                 */
        /* of course, that's for TrueType                                  */
        is_top_right_blue =
          (FT_Byte)( ( blue->flags & AF_CJK_BLUE_TOP ) != 0 );
        is_major_dir =
          FT_BOOL( edge->dir == axis->major_dir );

        /* if it is a top zone, the edge must be against the major    */
        /* direction; if it is a bottom zone, it must be in the major */
        /* direction                                                  */
        if ( is_top_right_blue ^ is_major_dir )
        {
          FT_Pos    dist;
          AF_Width  compare;


          /* Compare the edge to the closest blue zone type */
          if ( FT_ABS( edge->fpos - blue->ref.org ) >
               FT_ABS( edge->fpos - blue->shoot.org ) )
            compare = &blue->shoot;
          else
            compare = &blue->ref;

          dist = edge->fpos - compare->org;
          if ( dist < 0 )
            dist = -dist;

          dist = FT_MulFix( dist, scale );
          if ( dist < best_dist )
          {
            best_dist = dist;
            best_blue = compare;
          }
        }
      }

      if ( best_blue )
        edge->blue_edge = best_blue;
    }
  }